

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<tinyusdz::value::half,_2UL>_> *value)

{
  bool bVar1;
  half2 local_26;
  half2 v;
  optional<std::array<tinyusdz::value::half,_2UL>_> *poStack_20;
  optional<std::array<tinyusdz::value::half,_2UL>_> *value_local;
  AsciiParser *this_local;
  
  poStack_20 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::operator=(poStack_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_26);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,2ul>>::operator=
                ((optional<std::array<tinyusdz::value::half,2ul>> *)poStack_20,&local_26);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half2> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half2 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}